

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O3

void __thiscall Fl_BMP_Image::Fl_BMP_Image(Fl_BMP_Image *this,char *bmp)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  FILE *__stream;
  byte bVar18;
  uint uVar19;
  uchar *puVar20;
  uchar uVar21;
  uint uVar22;
  char cVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  uchar colormap [256] [3];
  uint local_3a8;
  uint local_388;
  uint local_384;
  byte local_374;
  uint local_35c;
  uchar local_338 [776];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027ba10;
  __stream = (FILE *)fl_fopen(bmp,"rb");
  if (__stream == (FILE *)0x0) {
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
    return;
  }
  iVar11 = getc(__stream);
  uVar12 = getc(__stream);
  if (((char)iVar11 != 'B') || ((uVar12 & 0xff) != 0x4d)) {
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
    return;
  }
  read_dword((FILE *)__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar12 = read_dword((FILE *)__stream);
  uVar13 = read_dword((FILE *)__stream);
  if ((int)uVar13 < 0x28) {
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    getc(__stream);
    getc(__stream);
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    uVar25 = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    iVar11 = uVar13 - 0xc;
    local_388 = 3;
    uVar17 = 0;
    local_374 = 1;
    local_35c = 0xffffffff;
  }
  else {
    iVar11 = read_long((FILE *)__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = iVar11;
    uVar15 = read_long((FILE *)__stream);
    local_35c = (int)~uVar15 >> 0x1f | 1;
    uVar14 = -uVar15;
    if (0 < (int)uVar15) {
      uVar14 = uVar15;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = uVar14;
    getc(__stream);
    getc(__stream);
    uVar14 = getc(__stream);
    iVar11 = getc(__stream);
    uVar15 = iVar11 << 8;
    uVar14 = uVar14 & 0xff;
    uVar25 = uVar14 | uVar15 & 0xffff;
    local_3a8 = read_dword((FILE *)__stream);
    uVar24 = read_dword((FILE *)__stream);
    read_long((FILE *)__stream);
    read_long((FILE *)__stream);
    uVar17 = read_dword((FILE *)__stream);
    read_dword((FILE *)__stream);
    iVar11 = uVar13 - 0x28;
    local_388 = 3;
    local_374 = 1;
    if (((uVar14 | uVar15) & 0xfff8) == 0 || local_3a8 != 0) goto LAB_00209fe6;
    iVar26 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
    local_3a8 = 0;
    if ((iVar26 <= (int)(0x20 / (uVar14 | uVar15 & 0xffff))) ||
       (iVar27 = (this->super_Fl_RGB_Image).super_Fl_Image.h_,
       (((iVar26 + 7U >> 3) + 3 & 0xfffffffc) + ((uVar25 >> 3) * iVar26 + 3 & 0xfffffffc)) * iVar27
       != uVar24 * 2)) goto LAB_00209fe6;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = iVar27 / 2;
    local_388 = 4;
    local_374 = 0;
  }
  local_3a8 = 0;
LAB_00209fe6:
  if (0 < iVar11) {
    uVar14 = iVar11 + 1;
    do {
      getc(__stream);
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  if ((((this->super_Fl_RGB_Image).super_Fl_Image.w_ == 0) || (uVar25 == 0)) ||
     ((this->super_Fl_RGB_Image).super_Fl_Image.h_ == 0)) {
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  }
  else {
    uVar14 = 1 << ((byte)uVar25 & 0x1f);
    if (8 < uVar25) {
      uVar14 = uVar17;
    }
    if (uVar17 != 0) {
      uVar14 = uVar17;
    }
    if (0 < (int)uVar14) {
      uVar28 = (ulong)uVar14;
      puVar20 = local_338;
      do {
        fread(puVar20,1,3,__stream);
        if (0xc < (int)uVar13) {
          getc(__stream);
        }
        puVar20 = puVar20 + 3;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
    bVar30 = true;
    if (uVar25 == 0x10) {
      uVar13 = read_dword((FILE *)__stream);
      bVar30 = uVar13 != 0xf800;
    }
    if (uVar25 == 0x20) {
      local_388 = 4;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = local_388;
    uVar13 = local_388;
    if (uVar12 != 0) {
      fseek(__stream,(ulong)uVar12,0);
      uVar13 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
    }
    iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
    uVar12 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
    uVar28 = (long)(int)uVar13 * (long)(int)uVar12 * (long)iVar11;
    if (uVar28 < Fl_RGB_Image::max_size_ || uVar28 - Fl_RGB_Image::max_size_ == 0) {
      puVar20 = (uchar *)operator_new__((long)(int)(iVar11 * uVar12 * uVar13));
      (this->super_Fl_RGB_Image).array = puVar20;
      local_384 = (int)local_35c >> 0x1f & uVar12 - 1;
      if ((int)local_35c < 0) {
        uVar12 = 0xffffffff;
      }
      (this->super_Fl_RGB_Image).alloc_array = 1;
      uVar13 = 0;
      uVar14 = 0;
      if (local_384 != uVar12) {
        uVar17 = 0;
        uVar24 = 0;
        uVar15 = 0;
        do {
          uVar9 = local_338[5];
          uVar8 = local_338[4];
          uVar7 = local_338[3];
          uVar6 = local_338[2];
          uVar5 = local_338[1];
          uVar4 = local_338[0];
          puVar20 = (this->super_Fl_RGB_Image).array;
          uVar22 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
          if (uVar25 < 0x10) {
            puVar20 = puVar20 + (int)(uVar22 * local_384 * iVar11);
            if (uVar25 == 1) {
              if (0 < (int)uVar22) {
                iVar11 = uVar22 + 1;
                uVar15 = 0x80;
                do {
                  if (uVar15 == 0x80) {
                    uVar14 = getc(__stream);
                  }
                  uVar21 = uVar7;
                  uVar2 = uVar9;
                  uVar3 = uVar8;
                  if ((uVar15 & uVar14 & 0xff) == 0) {
                    uVar21 = uVar4;
                    uVar2 = uVar6;
                    uVar3 = uVar5;
                  }
                  *puVar20 = uVar2;
                  puVar20[1] = uVar3;
                  bVar29 = uVar15 < 2;
                  uVar15 = uVar15 >> 1;
                  if (bVar29) {
                    uVar15 = 0x80;
                  }
                  puVar20[2] = uVar21;
                  iVar11 = iVar11 + -1;
                  puVar20 = puVar20 + 3;
                } while (1 < iVar11);
                uVar22 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
              }
              iVar11 = uVar22 + 0xe;
              if (-1 < (int)(uVar22 + 7)) {
                iVar11 = uVar22 + 7;
              }
              for (uVar15 = iVar11 >> 3; (uVar15 & 3) != 0; uVar15 = uVar15 + 1) {
                getc(__stream);
              }
            }
            else if (uVar25 == 4) {
              if (0 < (int)uVar22) {
                cVar23 = -0x10;
                do {
                  uVar16 = 2;
                  if (uVar17 != 0) {
                    uVar16 = uVar17;
                  }
                  if (uVar17 == 0 && local_3a8 == 2) {
                    if (uVar24 != 0) {
                      uVar24 = uVar24 + 1;
                      do {
                        getc(__stream);
                        uVar24 = uVar24 - 1;
                      } while (1 < uVar24);
                      uVar24 = 0;
                    }
                    uVar16 = getc(__stream);
                    uVar19 = getc(__stream);
                    if (uVar16 != 0) goto LAB_0020a762;
                    if (uVar19 != 0) {
                      if (uVar19 == 2) {
                        iVar11 = getc(__stream);
                        iVar26 = getc(__stream);
                        uVar17 = iVar26 * iVar11 * (this->super_Fl_RGB_Image).super_Fl_Image.w_ - 1;
                        uVar19 = 0;
                        uVar13 = 0;
                        if (cVar23 != -0x10) goto LAB_0020a848;
                        goto LAB_0020a786;
                      }
                      if (uVar19 != 1) {
                        uVar24 = -uVar19 >> 1 & 1;
                        uVar17 = uVar19 - 1;
                        uVar19 = 0xffffffff;
                        if (cVar23 == -0x10) goto LAB_0020a774;
                        goto LAB_0020a848;
                      }
                      uVar17 = 1;
                      break;
                    }
                    uVar22 = uVar22 + 1;
                    uVar17 = 0;
                  }
                  else {
                    uVar19 = -(uint)(uVar17 == 0) | uVar13;
LAB_0020a762:
                    uVar17 = uVar16 - 1;
                    if (cVar23 == -0x10) {
                      uVar13 = uVar19;
                      if ((int)uVar19 < 0) {
LAB_0020a774:
                        uVar13 = getc(__stream);
                      }
LAB_0020a786:
                      uVar15 = uVar13;
                      lVar1 = (ulong)(uVar15 >> 4 & 0xf) * 3;
                      *puVar20 = local_338[lVar1 + 2];
                      puVar20[1] = local_338[lVar1 + 1];
                      puVar20[2] = local_338[lVar1];
                      cVar23 = '\x0f';
                      uVar13 = uVar19;
                    }
                    else {
LAB_0020a848:
                      lVar1 = (ulong)(uVar15 & 0xf) * 3;
                      *puVar20 = local_338[lVar1 + 2];
                      puVar20[1] = local_338[lVar1 + 1];
                      puVar20[2] = local_338[lVar1];
                      cVar23 = -0x10;
                      uVar13 = uVar19;
                    }
                    puVar20 = puVar20 + 3;
                  }
                  bVar29 = 1 < (int)uVar22;
                  uVar22 = uVar22 - 1;
                } while (bVar29);
              }
              if (local_3a8 == 0) {
                iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                for (uVar15 = (iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1; (uVar15 & 3) != 0;
                    uVar15 = uVar15 + 1) {
                  getc(__stream);
                }
              }
            }
            else {
              uVar16 = uVar17;
              if (uVar25 == 8) {
                while (uVar17 = uVar16, 0 < (int)uVar22) {
                  if (local_3a8 != 1) {
                    uVar16 = 1;
                    uVar13 = 0xffffffff;
                  }
                  uVar17 = uVar13;
                  if (uVar16 != 0) {
LAB_0020a386:
                    uVar13 = uVar17;
                    if ((int)uVar17 < 0) goto LAB_0020a38d;
                    goto LAB_0020a3aa;
                  }
                  if (uVar24 != 0) {
                    uVar24 = uVar24 + 1;
                    do {
                      getc(__stream);
                      uVar24 = uVar24 - 1;
                    } while (1 < uVar24);
                    uVar24 = 0;
                  }
                  uVar16 = getc(__stream);
                  uVar17 = getc(__stream);
                  if (uVar16 != 0) goto LAB_0020a386;
                  uVar16 = uVar17;
                  if (uVar17 != 0) {
                    if (uVar17 == 2) {
                      iVar11 = getc(__stream);
                      iVar26 = getc(__stream);
                      uVar16 = iVar26 * iVar11 * (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                      uVar13 = 0;
                      uVar17 = 0;
                    }
                    else {
                      if (uVar17 == 1) break;
                      uVar24 = uVar17 & 1;
                      uVar13 = 0xffffffff;
LAB_0020a38d:
                      uVar17 = getc(__stream);
                    }
LAB_0020a3aa:
                    lVar1 = (long)(int)uVar17 * 3;
                    *puVar20 = local_338[lVar1 + 2];
                    puVar20[1] = local_338[lVar1 + 1];
                    puVar20[2] = local_338[lVar1];
                    puVar20 = puVar20 + (4 - (ulong)local_374);
                    uVar22 = uVar22 - 1;
                    uVar15 = uVar17;
                    uVar16 = uVar16 - 1;
                  }
                }
                if (local_3a8 == 0) {
                  for (uVar15 = (this->super_Fl_RGB_Image).super_Fl_Image.w_; (uVar15 & 3) != 0;
                      uVar15 = uVar15 + 1) {
                    getc(__stream);
                  }
                }
              }
            }
          }
          else if (uVar25 == 0x10) {
            if (0 < (int)uVar22) {
              iVar26 = uVar22 + 1;
              puVar20 = puVar20 + (long)(int)(iVar11 * uVar22 * local_384) + 2;
              do {
                uVar15 = getc(__stream);
                iVar11 = getc(__stream);
                bVar10 = (byte)iVar11;
                if (bVar30) {
                  bVar18 = (byte)(uVar15 >> 2) & 0x38 | (byte)(iVar11 << 6);
                  bVar10 = bVar10 * '\x02';
                }
                else {
                  bVar18 = (byte)(uVar15 >> 3) & 0x1c | (byte)(iVar11 << 5);
                }
                *puVar20 = (char)uVar15 << 3;
                puVar20[-1] = bVar18;
                puVar20[-2] = bVar10 & 0xf8;
                iVar26 = iVar26 + -1;
                puVar20 = puVar20 + local_388;
              } while (1 < iVar26);
              uVar22 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
            }
            uVar15 = uVar22 * 2;
            uVar22 = uVar22 & 1;
            while (uVar22 != 0) {
              getc(__stream);
              uVar15 = uVar15 + 1;
              uVar22 = uVar15 & 3;
            }
          }
          else if (uVar25 == 0x18) {
            if (0 < (int)uVar22) {
              uVar15 = uVar22 + 1;
              puVar20 = puVar20 + (long)(int)(iVar11 * uVar22 * local_384) + 2;
              do {
                iVar11 = getc(__stream);
                *puVar20 = (uchar)iVar11;
                iVar11 = getc(__stream);
                puVar20[-1] = (uchar)iVar11;
                iVar11 = getc(__stream);
                puVar20[-2] = (uchar)iVar11;
                uVar15 = uVar15 - 1;
                puVar20 = puVar20 + local_388;
              } while (1 < uVar15);
              uVar22 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
            }
            uVar15 = uVar22 * 3;
            if ((uVar15 & 3) != 0) {
              uVar16 = uVar15;
              do {
                uVar16 = uVar16 + 1;
                getc(__stream);
              } while ((uVar16 & 3) != 0);
              uVar15 = uVar15 + (uVar22 - 1 & 3) + 1;
            }
          }
          else if ((uVar25 == 0x20) && (0 < (int)uVar22)) {
            uVar16 = uVar22 + 1;
            puVar20 = puVar20 + (long)(int)(iVar11 * uVar22 * local_384) + 3;
            do {
              iVar11 = getc(__stream);
              puVar20[-1] = (uchar)iVar11;
              iVar11 = getc(__stream);
              puVar20[-2] = (uchar)iVar11;
              iVar11 = getc(__stream);
              puVar20[-3] = (uchar)iVar11;
              iVar11 = getc(__stream);
              *puVar20 = (uchar)iVar11;
              uVar16 = uVar16 - 1;
              puVar20 = puVar20 + local_388;
            } while (1 < uVar16);
          }
          local_384 = local_384 + local_35c;
        } while (local_384 != uVar12);
      }
      if ((local_374 == 0) && (iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.h_, 0 < iVar11)) {
        do {
          iVar26 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          if (0 < iVar26) {
            puVar20 = (this->super_Fl_RGB_Image).array +
                      (long)(iVar26 * (iVar11 + -1)) *
                      (long)(this->super_Fl_RGB_Image).super_Fl_Image.d_ + 3;
            iVar26 = iVar26 + 1;
            uVar12 = 0x80;
            do {
              if (uVar12 == 0x80) {
                uVar14 = getc(__stream);
              }
              uVar13 = uVar12 & uVar14 & 0xff;
              bVar30 = uVar12 < 2;
              uVar12 = uVar12 >> 1;
              if (bVar30) {
                uVar12 = 0x80;
              }
              *puVar20 = -(uVar13 == 0);
              puVar20 = puVar20 + local_388;
              iVar26 = iVar26 + -1;
            } while (1 < iVar26);
            iVar26 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          }
          iVar27 = iVar26 + 0xe;
          if (-1 < iVar26 + 7) {
            iVar27 = iVar26 + 7;
          }
          for (uVar12 = iVar27 >> 3; (uVar12 & 3) != 0; uVar12 = uVar12 + 1) {
            getc(__stream);
          }
          bVar30 = 1 < iVar11;
          iVar11 = iVar11 + -1;
        } while (bVar30);
      }
      fclose(__stream);
      return;
    }
    (*Fl::warning)("BMP file \"%s\" is too large!\n",bmp);
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  }
  return;
}

Assistant:

Fl_BMP_Image::Fl_BMP_Image(const char *bmp) // I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		info_size,	// Size of info header
		depth,		// Depth of image (bits)
		bDepth = 3,	// Depth of image (bytes)
		compression,	// Type of compression
		colors_used,	// Number of colors used
		x, y,		// Looping vars
		color,		// Color of RLE pixel
		repcount,	// Number of times to repeat
		temp,		// Temporary color
		align,		// Alignment bytes
		dataSize,	// number of bytes in image data set
		row_order,	// 1 = normal;  -1 = flipped row order
		start_y,	// Beginning Y
		end_y;		// Ending Y
  long		offbits;	// Offset to image data
  uchar		bit,		// Bit in image
		byte;		// Byte in image
  uchar		*ptr;		// Pointer into pixels
  uchar		colormap[256][3];// Colormap
  uchar		havemask;	// Single bit mask follows image data
  int		use_5_6_5;	// Use 5:6:5 for R:G:B channels in 16 bit images


  // Open the file...
  if ((fp = fl_fopen(bmp, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  // Get the header...
  byte = (uchar)getc(fp);	// Check "BM" sync chars
  bit  = (uchar)getc(fp);
  if (byte != 'B' || bit != 'M') {
    fclose(fp);
    ld(ERR_FORMAT);
    return;
  }

  read_dword(fp);		// Skip size
  read_word(fp);		// Skip reserved stuff
  read_word(fp);
  offbits = (long)read_dword(fp);// Read offset to image data

  // Then the bitmap information...
  info_size = read_dword(fp);

//  printf("offbits = %ld, info_size = %d\n", offbits, info_size);

  havemask  = 0;
  row_order = -1;
  use_5_6_5 = 0;

  if (info_size < 40) {
    // Old Windows/OS2 BMP header...
    w(read_word(fp));
    h(read_word(fp));
    read_word(fp);
    depth = read_word(fp);
    compression = BI_RGB;
    colors_used = 0;

    repcount = info_size - 12;
  } else {
    // New BMP header...
    w(read_long(fp));
    // If the height is negative, the row order is flipped
    temp = read_long(fp);
    if (temp < 0) row_order = 1;
    h(abs(temp));
    read_word(fp);
    depth = read_word(fp);
    compression = read_dword(fp);
    dataSize = read_dword(fp);
    read_long(fp);
    read_long(fp);
    colors_used = read_dword(fp);
    read_dword(fp);

    repcount = info_size - 40;

    if (!compression && depth>=8 && w()>32/depth) {
      int Bpp = depth/8;
      int maskSize = (((w()*Bpp+3)&~3)*h()) + (((((w()+7)/8)+3)&~3)*h());
      if (maskSize==2*dataSize) {
        havemask = 1;
	h(h()/2);
	bDepth = 4;
      }
    }
  }

//  printf("w() = %d, h() = %d, depth = %d, compression = %d, colors_used = %d, repcount = %d\n",
//         w(), h(), depth, compression, colors_used, repcount);

  // Skip remaining header bytes...
  while (repcount > 0) {
    getc(fp);
    repcount --;
  }

  // Check header data...
  if (!w() || !h() || !depth) {
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  // Get colormap...
  if (colors_used == 0 && depth <= 8)
    colors_used = 1 << depth;

  for (repcount = 0; repcount < colors_used; repcount ++) {
    // Read BGR color...
    if (fread(colormap[repcount], 1, 3, fp)==0) { /* ignore */ }

    // Skip pad byte for new BMP files...
    if (info_size > 12) getc(fp);
  }

  // Read first dword of colormap. It tells us if 5:5:5 or 5:6:5 for 16 bit
  if (depth == 16)
    use_5_6_5 = (read_dword(fp) == 0xf800);

  // Set byte depth for RGBA images
  if (depth == 32)
    bDepth=4;

  // Setup image and buffers...
  d(bDepth);
  if (offbits) fseek(fp, offbits, SEEK_SET);

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("BMP file \"%s\" is too large!\n", bmp);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image data...
  color = 0;
  repcount = 0;
  align = 0;
  byte  = 0;
  temp  = 0;

  if (row_order < 0) {
    start_y = h() - 1;
    end_y   = -1;
  } else {
    start_y = 0;
    end_y   = h();
  }

  for (y = start_y; y != end_y; y += row_order) {
    ptr = (uchar *)array + y * w() * d();

    switch (depth)
    {
      case 1 : // Bitmap
          for (x = w(), bit = 128; x > 0; x --) {
	    if (bit == 128) byte = (uchar)getc(fp);

	    if (byte & bit) {
	      *ptr++ = colormap[1][2];
	      *ptr++ = colormap[1][1];
	      *ptr++ = colormap[1][0];
	    } else {
	      *ptr++ = colormap[0][2];
	      *ptr++ = colormap[0][1];
	      *ptr++ = colormap[0][0];
	    }

	    if (bit > 1)
	      bit >>= 1;
	    else
	      bit = 128;
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = (w() + 7) / 8; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 4 : // 16-color
          for (x = w(), bit = 0xf0; x > 0; x --) {
	    // Get a new repcount as needed...
	    if (repcount == 0) {
              if (compression != BI_RLE4) {
		repcount = 2;
		color = -1;
              } else {
		while (align > 0) {
	          align --;
		  getc(fp);
        	}

		if ((repcount = getc(fp)) == 0) {
		  if ((repcount = getc(fp)) == 0) {
		    // End of line...
                    x ++;
		    continue;
		  } else if (repcount == 1) {
                    // End of image...
		    break;
		  } else if (repcount == 2) {
		    // Delta...
		    repcount = getc(fp) * getc(fp) * w();
		    color = 0;
		  } else {
		    // Absolute...
		    color = -1;
		    align = ((4 - (repcount & 3)) / 2) & 1;
		  }
		} else {
	          color = getc(fp);
		}
	      }
	    }

            // Get a new color as needed...
	    repcount --;

	    // Extract the next pixel...
            if (bit == 0xf0) {
	      // Get the next color byte as needed...
              if (color < 0) temp = getc(fp);
	      else temp = color;

              // Copy the color value...
	      *ptr++ = colormap[(temp >> 4) & 15][2];
	      *ptr++ = colormap[(temp >> 4) & 15][1];
	      *ptr++ = colormap[(temp >> 4) & 15][0];

	      bit  = 0x0f;
	    } else {
	      bit  = 0xf0;

              // Copy the color value...
	      *ptr++ = colormap[temp & 15][2];
	      *ptr++ = colormap[temp & 15][1];
	      *ptr++ = colormap[temp & 15][0];
	    }

	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = (w() + 1) / 2; temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 8 : // 256-color
          for (x = w(); x > 0; x --) {
	    // Get a new repcount as needed...
            if (compression != BI_RLE8) {
	      repcount = 1;
	      color = -1;
            }

	    if (repcount == 0) {
	      while (align > 0) {
	        align --;
		getc(fp);
              }

	      if ((repcount = getc(fp)) == 0) {
		if ((repcount = getc(fp)) == 0) {
		  // End of line...
                  x ++;
		  continue;
		} else if (repcount == 1) {
		  // End of image...
		  break;
		} else if (repcount == 2) {
		  // Delta...
		  repcount = getc(fp) * getc(fp) * w();
		  color = 0;
		} else {
		  // Absolute...
		  color = -1;
		  align = (2 - (repcount & 1)) & 1;
		}
	      } else {
	        color = getc(fp);
              }
            }

            // Get a new color as needed...
            if (color < 0) temp = getc(fp);
	    else temp = color;

            repcount --;

            // Copy the color value...
	    *ptr++ = colormap[temp][2];
	    *ptr++ = colormap[temp][1];
	    *ptr++ = colormap[temp][0];
	    if (havemask) ptr++;
	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = w(); temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 16 : // 16-bit 5:5:5 or 5:6:5 RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    uchar b = getc(fp), a = getc(fp) ;
	    if (use_5_6_5) {
		ptr[2] = (uchar)(( b << 3 ) & 0xf8);
		ptr[1] = (uchar)(((a << 5) & 0xe0) | ((b >> 3) & 0x1c));
		ptr[0] = (uchar)(a & 0xf8);
	    } else {
		ptr[2] = (uchar)((b << 3) & 0xf8);
		ptr[1] = (uchar)(((a << 6) & 0xc0) | ((b >> 2) & 0x38));
		ptr[0] = (uchar)((a<<1) & 0xf8);
	    }
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 2; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 24 : // 24-bit RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    ptr[2] = (uchar)getc(fp);
	    ptr[1] = (uchar)getc(fp);
	    ptr[0] = (uchar)getc(fp);
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 3; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;
		  
      case 32 : // 32-bit RGBA
         for (x = w(); x > 0; x --, ptr += bDepth) {
            ptr[2] = (uchar)getc(fp);
            ptr[1] = (uchar)getc(fp);
            ptr[0] = (uchar)getc(fp);
            ptr[3] = (uchar)getc(fp);
          }
          break;
    }
  }
  
  if (havemask) {
    for (y = h() - 1; y >= 0; y --) {
      ptr = (uchar *)array + y * w() * d() + 3;
      for (x = w(), bit = 128; x > 0; x --, ptr+=bDepth) {
	if (bit == 128) byte = (uchar)getc(fp);
	if (byte & bit)
	  *ptr = 0;
	else
	  *ptr = 255;
	if (bit > 1)
	  bit >>= 1;
	else
	  bit = 128;
      }
      // Read remaining bytes to align to 32 bits...
      for (temp = (w() + 7) / 8; temp & 3; temp ++)
	getc(fp);
    }
  }

  // Close the file and return...
  fclose(fp);
}